

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcConversionBasedUnit::~IfcConversionBasedUnit
          (IfcConversionBasedUnit *this)

{
  _func_int *p_Var1;
  void *pvVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>
           ._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcNamedUnit).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper
           + (long)p_Var3);
  pvVar2 = &this->field_0x58 + (long)p_Var3;
  *(undefined ***)((long)pvVar2 + -0x58) = &PTR__IfcConversionBasedUnit_00927cc0;
  *(undefined ***)((long)pvVar2 + 0x18) = &PTR__IfcConversionBasedUnit_00927d10;
  *(undefined ***)((long)pvVar2 + -0x20) = &PTR__IfcConversionBasedUnit_00927ce8;
  if (*(void **)((long)pvVar2 + -0x10) != pvVar2) {
    operator_delete(*(void **)((long)pvVar2 + -0x10));
  }
  *(undefined8 *)p_Var1 = 0x927d38;
  *(undefined8 *)(p_Var1 + 0x70) = 0x927d60;
  if (*(code **)(p_Var1 + 0x18) != p_Var1 + 0x28) {
    operator_delete(*(code **)(p_Var1 + 0x18));
  }
  operator_delete(p_Var1);
  return;
}

Assistant:

IfcConversionBasedUnit() : Object("IfcConversionBasedUnit") {}